

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addRule(LogicProgram *this,Rule *rule)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  RuleBuilder *this_00;
  RuleBuilder *other;
  uint *puVar4;
  PrgAtom *this_01;
  long in_RSI;
  LogicProgram *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  iterator end_1;
  iterator it_1;
  iterator end;
  iterator it;
  RuleTransform tm;
  int oId;
  Rule sRule;
  SRule meta;
  LogicProgram *in_stack_ffffffffffffff28;
  LogicProgram *in_stack_ffffffffffffff30;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  LogicProgram *in_stack_ffffffffffffff50;
  uint *local_a8;
  SRule *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  LogicProgram *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Strategy in_stack_ffffffffffffffac;
  Rule *in_stack_ffffffffffffffb0;
  RuleTransform *in_stack_ffffffffffffffb8;
  SRule local_1c;
  long local_10;
  
  local_10 = in_RSI;
  bVar2 = ProgramBuilder::frozen(&in_RDI->super_ProgramBuilder);
  if (!bVar2) {
    SRule::SRule(&local_1c);
    bVar2 = simplifyRule(in_stack_ffffffffffffff50,
                         (Rule *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                         (RuleBuilder *)in_stack_ffffffffffffff40._M_cur,(SRule *)in_RDI);
    if (bVar2) {
      Potassco::RuleBuilder::rule
                ((RuleBuilder *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      upStat(in_RDI,(Head_t)(E)((ulong)in_stack_ffffffffffffff40._M_cur >> 0x20),
             (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      bVar2 = handleNatively((LogicProgram *)
                             CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
                             (Rule *)in_stack_ffffffffffffff40._M_cur);
      if (bVar2) {
        addRule(in_stack_ffffffffffffff90,
                (Rule *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                in_stack_ffffffffffffff80);
      }
      else {
        upStat(in_stack_ffffffffffffff28,(Body_t)(E)((ulong)in_stack_ffffffffffffff30 >> 0x20),0);
        sVar3 = Potassco::size<unsigned_int>((Span<unsigned_int> *)&stack0xffffffffffffffb0);
        if ((sVar3 < 2) &&
           (bVar2 = transformNoAux(in_stack_ffffffffffffff30,(Rule *)in_stack_ffffffffffffff28),
           bVar2)) {
          iVar1 = in_RDI->statsId_;
          in_RDI->statsId_ = 1;
          RuleTransform::RuleTransform
                    ((RuleTransform *)in_stack_ffffffffffffff50,
                     (LogicProgram *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
          upStat(in_stack_ffffffffffffff28,(Body_t)(E)((ulong)in_stack_ffffffffffffff30 >> 0x20),0);
          upStat(in_RDI,(Head_t)(E)((ulong)in_stack_ffffffffffffff40._M_cur >> 0x20),
                 (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
          RuleTransform::transform
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
          in_RDI->statsId_ = iVar1;
          RuleTransform::~RuleTransform((RuleTransform *)in_stack_ffffffffffffff30);
        }
        else {
          this_00 = (RuleBuilder *)
                    Potassco::begin<unsigned_int>((Span<unsigned_int> *)&stack0xffffffffffffffb0);
          other = (RuleBuilder *)Potassco::end<unsigned_int>((Span<unsigned_int> *)0x17c695);
          for (; this_00 != other; this_00 = (RuleBuilder *)((long)&(this_00->mem_).beg_ + 4)) {
            resize(in_stack_ffffffffffffff30,(Atom_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          }
          in_stack_ffffffffffffff28 = (LogicProgram *)&in_RDI->extended_;
          in_stack_ffffffffffffff30 = (LogicProgram *)operator_new(0x10);
          Potassco::RuleBuilder::RuleBuilder(this_00,other);
          bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::
          push_back((pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_> *
                    )in_stack_ffffffffffffff40._M_cur,(RuleBuilder **)in_RDI);
        }
      }
    }
    if (in_RDI->statsId_ == 0) {
      local_a8 = Potassco::begin<unsigned_int>((Span<unsigned_int> *)(local_10 + 8));
      puVar4 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x17c772);
      for (; local_a8 != puVar4; local_a8 = local_a8 + 1) {
        bVar2 = isNew(in_stack_ffffffffffffff30,(Atom_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        if (bVar2) {
          bVar2 = validAtom(in_stack_ffffffffffffff30,
                            (Id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          if (bVar2) {
            this_01 = getAtom(in_stack_ffffffffffffff30,
                              (Id_t)((ulong)in_stack_ffffffffffffff28 >> 0x20));
            PrgHead::setInUpper(&this_01->super_PrgHead,true);
          }
          else {
            pVar5 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)in_stack_ffffffffffffff40._M_cur,(value_type *)in_RDI);
            in_stack_ffffffffffffff40._M_cur =
                 (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
          }
        }
      }
    }
    Potassco::RuleBuilder::clear((RuleBuilder *)in_stack_ffffffffffffff30);
    return in_RDI;
  }
  Potassco::fail(-2,"LogicProgram &Clasp::Asp::LogicProgram::addRule(const Rule &)",0x312,
                 "!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addRule(const Rule& rule) {
	check_not_frozen();
	SRule meta;
	if (simplifyRule(rule, rule_, meta)) {
		Rule sRule = rule_.rule();
		upStat(sRule.ht);
		if (handleNatively(sRule)) { // and can be handled natively
			addRule(sRule, meta);
		}
		else {
			upStat(sRule.bt);
			if (Potassco::size(sRule.head) <= 1 && transformNoAux(sRule)) {
				// rule transformation does not require aux atoms - do it now
				int oId  = statsId_;
				statsId_ = 1;
				RuleTransform tm(*this);
				upStat(sRule.bt, -1);
				upStat(rule.ht, -1);
				tm.transform(sRule, RuleTransform::strategy_no_aux);
				statsId_ = oId;
			}
			else {
				// make sure we have all head atoms
				for (Potassco::AtomSpan::iterator it = Potassco::begin(sRule.head), end = Potassco::end(sRule.head); it != end; ++it) {
					resize(*it);
				}
				extended_.push_back(new RuleBuilder(rule_));
			}
		}
	}
	if (statsId_ == 0) {
		// Assume all (new) heads are initially in "upper" closure.
		for (Potassco::AtomSpan::iterator it = Potassco::begin(rule.head), end = Potassco::end(rule.head); it != end; ++it) {
			if (!isNew(*it)) continue;
			if (validAtom(*it))
				getAtom(*it)->setInUpper(true);
			else
				auxData_->skippedHeads.insert(*it);
		}
	}
	rule_.clear();
	return *this;
}